

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

string * __thiscall
jsonip::parser::IStreamReader::to_string_abi_cxx11_
          (string *__return_storage_ptr__,IStreamReader *this,undefined8 param_3,undefined8 param_4,
          size_type param_5)

{
  undefined1 auVar1 [16];
  undefined1 local_60 [8];
  vector<char,_std::allocator<char>_> buffer;
  allocator_type local_31;
  
  auVar1 = std::istream::tellg();
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = auVar1._0_8_;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_60,param_5,&local_31);
  std::istream::seekg(this->in_,param_3,param_4);
  std::istream::read((char *)this->in_,(long)local_60);
  std::istream::seekg(this->in_,
                      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,auVar1._8_8_);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)__return_storage_ptr__,local_60,
             buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(PositionType p, std::size_t size)
        {
            const std::streampos old = in_.tellg();

            std::vector<char> buffer(size);
            in_.seekg(p);
            in_.read(&*buffer.begin(), size);
            in_.seekg(old);

            return std::string(buffer.begin(), buffer.end());
        }